

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall
CTcStreamLayout::calc_layout(CTcStreamLayout *this,CTcDataStream *ds,ulong max_len,int is_first)

{
  int iVar1;
  CTcStreamAnchor *pCVar2;
  int in_ECX;
  CTcStreamAnchor *in_RDX;
  CTcDataStream *in_RSI;
  CTcDataStream *in_RDI;
  ulong len;
  ulong pgsiz;
  CTcStreamAnchor *anchor;
  ulong free_ofs;
  ulong rem;
  ulong in_stack_ffffffffffffffa8;
  CTcStreamAnchor *in_stack_ffffffffffffffb8;
  CTcStreamAnchor *local_40;
  CTcStreamAnchor *local_38;
  long local_30;
  CTcStreamAnchor *local_28;
  
  if (in_ECX == 0) {
    pCVar2 = CTcDataStream::get_first_anchor(in_RSI);
    if (pCVar2 == (CTcStreamAnchor *)0x0) {
      return;
    }
    local_28 = (CTcStreamAnchor *)0x0;
    local_30 = (long)in_RDI->_vptr_CTcDataStream * in_RDI->ofs_;
  }
  else {
    for (local_40 = (CTcStreamAnchor *)0x800; local_40 < in_RDX;
        local_40 = (CTcStreamAnchor *)((long)local_40 << 1)) {
    }
    in_RDI->_vptr_CTcDataStream = (_func_int **)local_40;
    local_28 = local_40;
    local_30 = 0;
    in_RDI->ofs_ = 1;
  }
  for (local_38 = CTcDataStream::get_first_anchor(in_RSI); local_38 != (CTcStreamAnchor *)0x0;
      local_38 = local_38->nxt_) {
    iVar1 = CTcStreamAnchor::is_replaced(local_38);
    if (iVar1 == 0) {
      in_stack_ffffffffffffffb8 =
           (CTcStreamAnchor *)CTcStreamAnchor::get_len(in_stack_ffffffffffffffb8,in_RDI);
      if (local_28 < in_stack_ffffffffffffffb8) {
        local_30 = (long)&local_28->nxt_ + local_30;
        in_RDI->ofs_ = in_RDI->ofs_ + 1;
        local_28 = (CTcStreamAnchor *)in_RDI->_vptr_CTcDataStream;
      }
      CTcStreamAnchor::set_addr((CTcStreamAnchor *)in_RDI,in_stack_ffffffffffffffa8);
      local_30 = (long)&in_stack_ffffffffffffffb8->nxt_ + local_30;
      local_28 = (CTcStreamAnchor *)((long)local_28 - (long)in_stack_ffffffffffffffb8);
    }
  }
  if (local_30 == 0) {
    in_RDI->ofs_ = 0;
  }
  return;
}

Assistant:

void CTcStreamLayout::calc_layout(CTcDataStream *ds, ulong max_len,
                                  int is_first)
{
    ulong rem;
    ulong free_ofs;
    CTcStreamAnchor *anchor;

    /* if this is the first page, handle some things specially */
    if (is_first)
    {
        ulong pgsiz;

        /* 
         *   Starting at 2k, look for a page size that will fit the
         *   desired minimum size.  
         */
        for (pgsiz = 2048 ; pgsiz < max_len ; pgsiz <<= 1) ;

        /* remember our selected page size */
        page_size_ = pgsiz;

        /* start at the bottom of the first page */
        rem = pgsiz;
        free_ofs = 0;
        page_cnt_ = 1;
    }
    else
    {
        /* 
         *   this isn't the first page - if there are no anchors, don't
         *   bother adding anything 
         */
        if (ds->get_first_anchor() == 0)
            return;

        /* 
         *   start at the end of the last existing page - this will ensure
         *   that everything added from the new stream will go onto a
         *   brand new page after everything from the previous stream 
         */
        rem = 0;
        free_ofs = page_size_ * page_cnt_;
    }
    
    /*
     *   Run through the list of stream anchors and calculate the layout.
     *   For each item, assign its final pool address and apply its
     *   fixups.  
     */
    for (anchor = ds->get_first_anchor() ; anchor != 0 ;
         anchor = anchor->nxt_)
    {
        ulong len;

        /* 
         *   if this anchor has been marked as replaced, don't include it
         *   in our calculations, because we don't want to include this
         *   block in the image file 
         */
        if (anchor->is_replaced())
            continue;
        
        /* 
         *   if this item fits on the current page, assign it the next
         *   sequential address; otherwise, go to the next page
         *   
         *   if this anchor is at the dividing point, put it on the next
         *   page, unless we just started a new page 
         */
        len = anchor->get_len(ds);
        if (len > rem)
        {
            /* 
             *   we must start the next page - skip to the next page by
             *   moving past the remaining free space on this page 
             */
            free_ofs += rem;

            /* count the new page */
            ++page_cnt_;

            /* the whole next page is available to us now */
            rem = page_size_;
        }

        /* 
         *   set the anchor's final address, which will apply fixups for
         *   the object's fixup list 
         */
        anchor->set_addr(free_ofs);

        /* advance past this block */
        free_ofs += len;
        rem -= len;
    }

    /* if there's no data at all, we have zero pages */
    if (free_ofs == 0)
        page_cnt_ = 0;
}